

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.H
# Opt level: O2

void __thiscall
amrex::AmrMesh::SetMaxGridSize(AmrMesh *this,Vector<int,_std::allocator<int>_> *new_mgs)

{
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_00;
  int iVar1;
  pointer pIVar2;
  long lVar3;
  int i;
  long lVar4;
  
  this_00 = &(this->super_AmrInfo).max_grid_size;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             (long)(this->super_AmrInfo).max_level + 1);
  lVar3 = 2;
  for (lVar4 = 0; lVar4 <= (this->super_AmrInfo).max_level; lVar4 = lVar4 + 1) {
    iVar1 = (new_mgs->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar4];
    pIVar2 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    pIVar2->vect[lVar3 + 0xfffffffffffffffe] = iVar1;
    pIVar2->vect[lVar3 + 0xffffffffffffffff] = iVar1;
    pIVar2->vect[lVar3] = iVar1;
    lVar3 = lVar3 + 3;
  }
  return;
}

Assistant:

void SetMaxGridSize (const Vector<int>& new_mgs) noexcept {
        max_grid_size.resize(max_level+1);
        for (int i = 0; i <= max_level; ++i) {
            max_grid_size[i] = IntVect{AMREX_D_DECL(new_mgs[i],new_mgs[i],new_mgs[i])};
        }
    }